

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

QString * vcCommandSeparator(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  (in_RDI->d).d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  (in_RDI->d).ptr = L"&#x000D;&#x000A;if errorlevel 1 goto VCReportError&#x000D;&#x000A;";
  local_28.size = 0;
  (in_RDI->d).size = 0x42;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString vcCommandSeparator()
{
    // MSVC transforms the build tree into a single batch file, simply pasting the contents
    // of the custom commands into it, and putting an "if errorlevel goto" statement behind it.
    // As we want every sub-command to be error-checked (as is done by makefile-based
    // backends), we insert the checks ourselves, using the undocumented jump target.
    return QStringLiteral("&#x000D;&#x000A;if errorlevel 1 goto VCReportError&#x000D;&#x000A;");
}